

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O1

uint8_t * CHUNKCOPY_SAFE(uint8_t *out,uint8_t *from,uint64_t len,uint8_t *safe)

{
  undefined8 uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *cur_chunk;
  undefined4 *__dest;
  uint uVar7;
  uint64_t bytes_remaining;
  undefined1 auVar8 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint8_t *local_38;
  
  __dest = &local_48;
  uVar3 = (long)out - (long)from;
  if (uVar3 == 0) goto LAB_001123b3;
  uVar6 = (long)safe - (long)out;
  if (uVar6 < len) {
    len = uVar6;
  }
  uVar4 = (long)safe - (long)from;
  uVar5 = -uVar4;
  if (0 < (long)uVar4) {
    uVar5 = uVar4;
  }
  if ((uVar6 < 0x10) || (uVar5 < 0x10)) {
    if (len == 0) {
      return out;
    }
    uVar3 = 0;
    do {
      out[uVar3] = from[uVar3];
      uVar3 = uVar3 + 1;
    } while (len != uVar3);
LAB_001122d0:
    return out + uVar3;
  }
  uVar6 = -uVar3;
  if (0 < (long)uVar3) {
    uVar6 = uVar3;
  }
  uVar7 = (uint)len;
  if (((long)uVar3 < 0) && (uVar3 = len & 0xffffffff, uVar6 < uVar3)) {
    memmove(out,from,uVar3);
    return out + uVar3;
  }
  if (uVar6 == 1) {
    len = len & 0xffffffff;
    memset(out,(uint)*from,len);
    goto LAB_001123b3;
  }
  if (0xf < uVar6) {
    uVar2 = uVar7 - 1 & 0xf;
    uVar1 = *(undefined8 *)(from + 8);
    *(undefined8 *)out = *(undefined8 *)from;
    *(undefined8 *)(out + 8) = uVar1;
    if (~uVar2 + uVar7 == 0) {
      return out + (ulong)uVar2 + 1;
    }
    uVar3 = (ulong)uVar2 + 1;
    do {
      uVar1 = *(undefined8 *)(from + uVar3 + 8);
      *(undefined8 *)(out + uVar3) = *(undefined8 *)(from + uVar3);
      *(undefined8 *)(out + uVar3 + 8) = uVar1;
      uVar3 = uVar3 + 0x10;
    } while (uVar7 != (uint)uVar3);
    goto LAB_001122d0;
  }
  if (uVar6 == 2) {
    auVar8 = pshuflw(ZEXT216(*(ushort *)from),ZEXT216(*(ushort *)from),0);
    local_48 = auVar8._0_4_;
    uStack_44 = local_48;
LAB_00112317:
    uVar2 = 0x10;
    uStack_40 = local_48;
    uStack_3c = uStack_44;
  }
  else {
    if (uVar6 == 4) {
      local_48 = *(undefined4 *)from;
      uStack_44 = local_48;
      goto LAB_00112317;
    }
    if (uVar6 == 8) {
      local_48 = *(undefined4 *)from;
      uStack_44 = *(undefined4 *)(from + 4);
      goto LAB_00112317;
    }
    uVar3 = 0x10;
    local_38 = from;
    do {
      uVar5 = uVar6;
      if (uVar3 < uVar6) {
        uVar5 = uVar3;
      }
      memcpy(__dest,local_38,uVar5);
      __dest = (undefined4 *)((long)__dest + uVar5);
      uVar3 = uVar3 - uVar5;
    } while (uVar3 != 0);
    uVar2 = 0x10 - (int)uVar5;
  }
  if (0x1f < uVar7) {
    do {
      *(ulong *)out = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + 8) = CONCAT44(uStack_3c,uStack_40);
      *(ulong *)(out + uVar2) = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + uVar2 + 8) = CONCAT44(uStack_3c,uStack_40);
      out = out + uVar2 * 2;
      uVar7 = (int)len + uVar2 * -2;
      len = (uint64_t)uVar7;
    } while (0x1f < uVar7);
  }
  uVar7 = (uint)len;
  if (0xf < uVar7) {
    do {
      *(ulong *)out = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + 8) = CONCAT44(uStack_3c,uStack_40);
      uVar7 = (int)len - uVar2;
      len = (uint64_t)uVar7;
      out = out + uVar2;
    } while (0xf < uVar7);
  }
  if (uVar7 == 0) {
    return out;
  }
  len = (uint64_t)uVar7;
  memcpy(out,&local_48,len);
LAB_001123b3:
  return out + len;
}

Assistant:

static inline uint8_t *CHUNKCOPY_SAFE(uint8_t *out, uint8_t *from, uint64_t len, uint8_t *safe)
{
    if (out == from)
        return out + len;

    uint64_t safelen = (safe - out);
    len = MIN(len, safelen);

#ifndef HAVE_MASKED_READWRITE
    uint64_t from_dist = (uint64_t)llabs(safe - from);
    if (UNLIKELY(from_dist < sizeof(chunk_t) || safelen < sizeof(chunk_t))) {
        while (len--) {
            *out++ = *from++;
        }

        return out;
    }
#endif

    return CHUNKMEMSET(out, from, (unsigned)len);
}